

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget.cpp
# Opt level: O3

void __thiscall
QGraphicsWidget::getWindowFrameMargins
          (QGraphicsWidget *this,qreal *left,qreal *top,qreal *right,qreal *bottom)

{
  QGraphicsWidgetPrivate *this_00;
  
  if (((left != (qreal *)0x0 || top != (qreal *)0x0) || right != (qreal *)0x0) ||
      bottom != (qreal *)0x0) {
    this_00 = *(QGraphicsWidgetPrivate **)(this + 0x18);
    QGraphicsWidgetPrivate::ensureWindowFrameMargins(this_00);
    if (left != (qreal *)0x0) {
      *left = ((this_00->windowFrameMargins)._M_t.
               super___uniq_ptr_impl<QMarginsF,_std::default_delete<QMarginsF>_>._M_t.
               super__Tuple_impl<0UL,_QMarginsF_*,_std::default_delete<QMarginsF>_>.
               super__Head_base<0UL,_QMarginsF_*,_false>._M_head_impl)->m_left;
    }
    if (top != (qreal *)0x0) {
      *top = ((this_00->windowFrameMargins)._M_t.
              super___uniq_ptr_impl<QMarginsF,_std::default_delete<QMarginsF>_>._M_t.
              super__Tuple_impl<0UL,_QMarginsF_*,_std::default_delete<QMarginsF>_>.
              super__Head_base<0UL,_QMarginsF_*,_false>._M_head_impl)->m_top;
    }
    if (right != (qreal *)0x0) {
      *right = ((this_00->windowFrameMargins)._M_t.
                super___uniq_ptr_impl<QMarginsF,_std::default_delete<QMarginsF>_>._M_t.
                super__Tuple_impl<0UL,_QMarginsF_*,_std::default_delete<QMarginsF>_>.
                super__Head_base<0UL,_QMarginsF_*,_false>._M_head_impl)->m_right;
    }
    if (bottom != (qreal *)0x0) {
      *bottom = ((this_00->windowFrameMargins)._M_t.
                 super___uniq_ptr_impl<QMarginsF,_std::default_delete<QMarginsF>_>._M_t.
                 super__Tuple_impl<0UL,_QMarginsF_*,_std::default_delete<QMarginsF>_>.
                 super__Head_base<0UL,_QMarginsF_*,_false>._M_head_impl)->m_bottom;
    }
  }
  return;
}

Assistant:

void QGraphicsWidget::getWindowFrameMargins(qreal *left, qreal *top, qreal *right, qreal *bottom) const
{
    Q_D(const QGraphicsWidget);
    if (left || top || right || bottom)
        d->ensureWindowFrameMargins();
    if (left)
        *left = d->windowFrameMargins->left();
    if (top)
        *top = d->windowFrameMargins->top();
    if (right)
        *right = d->windowFrameMargins->right();
    if (bottom)
        *bottom = d->windowFrameMargins->bottom();
}